

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_error.hpp
# Opt level: O0

bool boost::xpressive::detail::ensure_
               (bool cond,error_type code,char *msg,char *fun,char *file,unsigned_long line)

{
  type x;
  value_type in_RCX;
  byte in_DIL;
  value_type in_R8;
  value_type_conflict3 in_R9D;
  error_info<boost::throw_file_,_const_char_*> *in_stack_ffffffffffffff58;
  regex_error *in_stack_ffffffffffffff60;
  regex_error *in_stack_ffffffffffffff70;
  error_type in_stack_ffffffffffffff7c;
  regex_error *in_stack_ffffffffffffff80;
  error_info<boost::throw_function_,_const_char_*> local_70 [9];
  value_type_conflict3 local_28;
  value_type local_20;
  value_type local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 == 0) {
    local_20 = in_R8;
    local_18 = in_RCX;
    local_28 = in_R9D;
    regex_error::regex_error
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(char *)in_stack_ffffffffffffff70
              );
    error_info<boost::throw_function_,_const_char_*>::error_info(local_70,local_18);
    operator<<(in_stack_ffffffffffffff60,
               (error_info<boost::throw_function_,_const_char_*> *)in_stack_ffffffffffffff58);
    error_info<boost::throw_file_,_const_char_*>::error_info
              ((error_info<boost::throw_file_,_const_char_*> *)&stack0xffffffffffffff78,local_20);
    x = operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    error_info<boost::throw_line_,_int>::error_info
              ((error_info<boost::throw_line_,_int> *)&stack0xffffffffffffff74,local_28);
    operator<<(x,(error_info<boost::throw_line_,_int> *)in_stack_ffffffffffffff58);
    throw_exception<boost::xpressive::regex_error>(in_stack_ffffffffffffff70);
  }
  return true;
}

Assistant:

inline bool ensure_(
        bool cond
      , regex_constants::error_type code
      , char const *msg
      , char const *fun
      , char const *file
      , unsigned long line
    )
    {
        if(!cond)
        {
            #ifndef BOOST_EXCEPTION_DISABLE
            boost::throw_exception(
                boost::xpressive::regex_error(code, msg)
                    << boost::throw_function(fun)
                    << boost::throw_file(file)
                    << boost::throw_line((int)line)
            );
            #else
            boost::throw_exception(boost::xpressive::regex_error(code, msg));
            #endif
        }
        return true;
    }